

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void Cmd_printspans(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ushort *local_38;
  Span *spans;
  int x;
  FTexture *tex;
  FTextureID picnum;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  tex._4_4_ = key;
  _picnum = who;
  iVar3 = FCommandLine::argc(argv);
  if (iVar3 == 2) {
    pcVar4 = FCommandLine::operator[](argv,1);
    tex._0_4_ = FTextureManager::CheckForTexture(&TexMan,pcVar4,0,1);
    bVar2 = FTextureID::Exists((FTextureID *)&tex);
    if (bVar2) {
      spans._4_4_ = tex._0_4_;
      _x = FTextureManager::operator[](&TexMan,tex._0_4_);
      for (spans._0_4_ = 0; uVar1 = (uint)spans, iVar3 = FTexture::GetWidth(_x), (int)uVar1 < iVar3;
          spans._0_4_ = (uint)spans + 1) {
        Printf("%4d:",(ulong)(uint)spans);
        (*_x->_vptr_FTexture[2])(_x,(ulong)(uint)spans,&local_38);
        for (; local_38[1] != 0; local_38 = local_38 + 2) {
          Printf(" (%4d,%4d)",(ulong)*local_38,(ulong)(((uint)*local_38 + (uint)local_38[1]) - 1));
        }
        Printf("\n");
      }
    }
    else {
      pcVar4 = FCommandLine::operator[](argv,1);
      Printf("Unknown texture %s\n",pcVar4);
    }
  }
  return;
}

Assistant:

CCMD (printspans)
{
	if (argv.argc() != 2)
		return;

	FTextureID picnum = TexMan.CheckForTexture (argv[1], FTexture::TEX_Any);
	if (!picnum.Exists())
	{
		Printf ("Unknown texture %s\n", argv[1]);
		return;
	}
	FTexture *tex = TexMan[picnum];
	for (int x = 0; x < tex->GetWidth(); ++x)
	{
		const FTexture::Span *spans;
		Printf ("%4d:", x);
		tex->GetColumn (x, &spans);
		while (spans->Length != 0)
		{
			Printf (" (%4d,%4d)", spans->TopOffset, spans->TopOffset+spans->Length-1);
			spans++;
		}
		Printf ("\n");
	}
}